

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinity.cpp
# Opt level: O2

string * mask_to_string_abi_cxx11_(string *__return_storage_ptr__,uint64_t mask)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  uVar3 = 0x40;
  uVar2 = 0;
LAB_00114572:
  do {
    if (uVar3 == 0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
      return __return_storage_ptr__;
    }
    if ((mask >> (uVar3 - 1 & 0x3f) & 1) == 0) {
      if ((int)uVar2 != 0) {
        uVar3 = uVar3 - 1;
        std::operator<<((ostream *)&ss,'0');
        goto LAB_00114572;
      }
      uVar1 = 0;
    }
    else {
      uVar1 = uVar3 & 0xffffffff;
      if ((int)uVar2 != 0) {
        uVar1 = uVar2;
      }
      std::operator<<((ostream *)&ss,'1');
    }
    uVar3 = uVar3 - 1;
    uVar2 = uVar1;
  } while( true );
}

Assistant:

std::string
mask_to_string(uint64_t mask)
{
    std::ostringstream ss;
    unsigned len = 0;
    unsigned v = 0;
    unsigned i = 64;
    while (i--)
    {
        v = mask >> i;
        if (1ULL & v)
        {
            if (len == 0) len = i + 1;
            ss << '1';
        }
        else
            if (len > 0) ss << '0';
    }
    return ss.str();
}